

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall clinet::on_package(clinet *this,int netid,char *data,int len)

{
  uint __line;
  bool bVar1;
  int len_00;
  action_req *body;
  int msgid;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  action_req req_1;
  join_req req;
  
  switch(*(uint *)data) {
  case 2:
    if (*(int *)(data + 4) == 0) {
      this->userid_ = *(int *)(data + 8);
      printf(anon_var_dwarf_141);
      body = (action_req *)&req;
      req.gameid = 0;
      printf(anon_var_dwarf_157);
      __isoc99_scanf("%d",body);
      msgid = 3;
      len_00 = 4;
LAB_0010576e:
      send_message(this,msgid,body,len_00);
      return;
    }
    __line = 0x2e;
    break;
  default:
    printf(anon_var_dwarf_221,(ulong)*(uint *)data,data,&switchD_00105718::switchdataD_00108004);
    return;
  case 4:
    if (*(int *)(data + 4) == 0) {
      pcVar3 = &DAT_001082cf;
      goto LAB_00105843;
    }
    __line = 0x3c;
    break;
  case 5:
    uVar2 = (ulong)*(uint *)(data + 4);
    pcVar4 = data + 8;
    pcVar3 = anon_var_dwarf_17e;
    goto LAB_0010580a;
  case 6:
    uVar2 = (ulong)*(uint *)(data + 4);
    pcVar4 = data + 8;
    pcVar3 = anon_var_dwarf_194;
LAB_0010580a:
    printf(pcVar3,uVar2,pcVar4);
    return;
  case 8:
    if (*(int *)(data + 4) == 0) {
      return;
    }
    __line = 0x4f;
    break;
  case 9:
    printf(anon_var_dwarf_19e,(ulong)*(uint *)(data + 4),data + 8,(ulong)*(uint *)(data + 0x28),
           (ulong)*(uint *)(data + 0x2c));
    return;
  case 10:
    if (*(int *)(data + 8) == 3) {
      pcVar3 = &DAT_0010829d;
    }
    else {
      if (*(int *)(data + 8) != 0) {
        draw_chesses(data + 0xc);
        if (*(int *)(data + 8) == 1) {
          uVar2 = (ulong)*(uint *)(data + 0x10c);
          if (this->userid_ == *(uint *)(data + 0x10c)) {
            req_1.row = 0;
            req_1.col = 0;
            while( true ) {
              printf(anon_var_dwarf_1ee);
              __isoc99_scanf("%d,%d",&req_1,&req_1.col);
              bVar1 = check_valid(data + 0xc,req_1.row,req_1.col);
              if (bVar1) break;
              puts(&DAT_00108278);
            }
            msgid = 7;
            body = &req_1;
            len_00 = 8;
            goto LAB_0010576e;
          }
          pcVar4 = data + 0x110;
          pcVar3 = anon_var_dwarf_1d8;
        }
        else {
          if (*(int *)(data + 8) != 2) {
            return;
          }
          uVar2 = (ulong)*(uint *)(data + 0x10c);
          pcVar4 = data + 0x110;
          pcVar3 = anon_var_dwarf_1ce;
        }
        goto LAB_0010580a;
      }
      pcVar3 = &DAT_001082bc;
    }
LAB_00105843:
    puts(pcVar3);
    return;
  }
  __assert_fail("rsp->result == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/client.cpp"
                ,__line,"virtual void clinet::on_package(int, char *, int)");
}

Assistant:

void on_package(int netid, char* data, int len) override
    {
        message* _msg = (message*)data;
        switch (_msg->msgid)
        {
        case MSG_LOGIN_RSP:
        {
            login_rsp* rsp = (login_rsp*)_msg->body;
            assert(rsp->result == 0);
            
            userid_ = rsp->userid;
            printf("登录游戏成功，你的ID为%d\n", userid_);
            
            join_req req = { 0 };
            printf("请输入你要加入的房间id：");
            scanf("%d", &req.gameid);
            send_message(MSG_JOIN_REQ, &req, sizeof(req));
            break;
        }
        case MSG_JOIN_RSP:
        {
            join_rsp* rsp = (join_rsp*)_msg->body;
            assert(rsp->result == 0);
            printf("加入房间成功\n");
            break;
        }
        case MSG_JOIN_NTF:
        {
            join_ntf* ntf = (join_ntf*)_msg->body;
            printf("玩家[%d]-%s 加入房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_QUIT_NTF:
        {
            quit_ntf* ntf = (quit_ntf*)_msg->body;
            printf("玩家[%d]-%s 退出房间\n", ntf->userid, ntf->name);
            break;
        }
        case MSG_ACTION_RSP:
        {
            action_rsp* rsp = (action_rsp*)_msg->body;
            assert(rsp->result == 0);
            break;
        }
        case MSG_ACTION_NTF:
        {
            action_ntf* ntf = (action_ntf*)_msg->body;
            printf("玩家[%d]-%s 下了(%d,%d)\n", ntf->userid, ntf->name, ntf->row, ntf->col);
            break;
        }
        case MSG_STATUS_NTF:
        {
            status_ntf* ntf = (status_ntf*)_msg->body;
            if (ntf->state == STATE_WAITING) {
                printf("等待对手加入\n");
                return;
            }

            if (ntf->state == STATE_ABORTED) {
                printf("有棋手退出，游戏中止\n");
                return;
            }

            draw_chesses(ntf->chesses);
            if (ntf->state == STATE_FINISH) {
                printf("游戏结束，玩家[%d]-%s胜利\n", ntf->userid, ntf->name);
                return;
            }

            if (ntf->state == STATE_PLAYING) {
                if (userid_ != ntf->userid) {
                    printf("等待玩家[%d]-%s下棋\n", ntf->userid, ntf->name);
                    return;
                }
                
                action_req req = { 0 };
                while (true)
                {
                    printf("轮到你下棋，请输入坐标(x,y)：");
                    scanf("%d,%d", &req.row, &req.col);
                    if (check_valid(ntf->chesses, req.row, req.col)) {
                        break;
                    }
                    printf("你的输入无效，请重新输入\n");
                }
                send_message(MSG_ACTION_REQ, &req, sizeof(req));
            }
            
            break;
        }
        default:
        {
            printf("未知的消息id(%d)\n", _msg->msgid);
            break;
        }
        }
    }